

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

ValueDriver ** __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::overlap_iterator::operator*
          (overlap_iterator *this)

{
  bool bVar1;
  uint32_t i;
  LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true> *this_00;
  LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false> *this_01;
  ValueDriver **ppVVar2;
  uint32_t offset;
  const_iterator *in_stack_ffffffffffffffe0;
  
  i = IntervalMapDetails::Path::leafOffset((Path *)0x5573d3);
  bVar1 = const_iterator::isFlat(in_stack_ffffffffffffffe0);
  if (bVar1) {
    this_00 = IntervalMapDetails::Path::
              leaf<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,true>>
                        ((Path *)0x5573f5);
    ppVVar2 = IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>
              ::valueAt(this_00,i);
  }
  else {
    this_01 = IntervalMapDetails::Path::
              leaf<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,false>>
                        ((Path *)0x557416);
    ppVVar2 = IntervalMapDetails::
              LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>::valueAt
                        (this_01,i);
  }
  return ppVVar2;
}

Assistant:

const TValue& operator*() const {
        SLANG_ASSERT(valid());
        auto offset = this->path.leafOffset();
        return this->isFlat() ? this->path.template leaf<RootLeaf>().valueAt(offset)
                              : this->path.template leaf<Leaf>().valueAt(offset);
    }